

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O0

void tcg_gen_brcond_i32_aarch64
               (TCGContext_conflict1 *tcg_ctx,TCGCond cond,TCGv_i32 arg1,TCGv_i32 arg2,TCGLabel *l)

{
  TCGArg a4;
  TCGLabel *l_local;
  TCGv_i32 arg2_local;
  TCGv_i32 arg1_local;
  TCGCond cond_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (cond == TCG_COND_ALWAYS) {
    tcg_gen_br(tcg_ctx,l);
  }
  else if (cond != TCG_COND_NEVER) {
    *(uint *)l = *(uint *)l & 0xffff | ((*(uint *)l >> 0x10) + 1) * 0x10000;
    a4 = label_arg(l);
    tcg_gen_op4ii_i32(tcg_ctx,INDEX_op_brcond_i32,arg1,arg2,(ulong)cond,a4);
  }
  return;
}

Assistant:

void tcg_gen_brcond_i32(TCGContext *tcg_ctx, TCGCond cond, TCGv_i32 arg1, TCGv_i32 arg2, TCGLabel *l)
{
    if (cond == TCG_COND_ALWAYS) {
        tcg_gen_br(tcg_ctx, l);
    } else if (cond != TCG_COND_NEVER) {
        l->refs++;
        tcg_gen_op4ii_i32(tcg_ctx, INDEX_op_brcond_i32, arg1, arg2, cond, label_arg(l));
    }
}